

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::FoundationPileWithTwoTest_isSnapshotOfSameObject_Test::
~FoundationPileWithTwoTest_isSnapshotOfSameObject_Test
          (FoundationPileWithTwoTest_isSnapshotOfSameObject_Test *this)

{
  FoundationPileWithTwoTest_isSnapshotOfSameObject_Test *this_local;
  
  ~FoundationPileWithTwoTest_isSnapshotOfSameObject_Test(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_F(FoundationPileWithTwoTest, isSnapshotOfSameObject) {
    const auto snapshot = pile->createSnapshot();
    pile->initialize();
    const auto snapshotOfSameObject = pile->createSnapshot();
    const auto snapshotOfSameTypeObject = std::make_shared<FoundationPile>()->createSnapshot();
    SnapshotMock snapshotOfDifferentTypeObject;

    EXPECT_TRUE(snapshot->isSnapshotOfSameObject(*snapshotOfSameObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(*snapshotOfSameTypeObject));
    EXPECT_FALSE(snapshot->isSnapshotOfSameObject(snapshotOfDifferentTypeObject));
}